

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void read_bytes<unsigned_long,unsigned_int>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,size_t n_els,char **in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  pointer puVar1;
  pointer __dest;
  ulong __n;
  
  if (n_els == 0) {
    puVar1 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(vec);
    __n = 0;
  }
  else {
    __dest = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = n_els * 4;
    if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__dest) < __n) {
      std::vector<char,_std::allocator<char>_>::resize(buffer,n_els * 8);
      __dest = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    memcpy(__dest,*in,__n);
    *in = *in + __n;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(vec,n_els);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(vec);
    if (diff_endian) {
      swap_endianness<unsigned_int>
                ((uint *)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start,n_els);
    }
    convert_dtype<unsigned_long,unsigned_int>
              ((vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,buffer,n_els);
  }
  *in = *in + __n;
  return;
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, const char *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(vec, n_els, in);
        if (unlikely(diff_endian)) swap_endianness(vec.data(), n_els);
        return;
    }
    if (n_els) {
        if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
            buffer.resize((size_t)2 * n_els * sizeof(saved_type));
        read_bytes<saved_type>(buffer.data(), n_els, in);
        vec.resize(n_els);
        vec.shrink_to_fit();
        
        if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
        convert_dtype<dtype, saved_type>(vec.data(), buffer, n_els);
    }
    
    else {
        vec.clear();
        vec.shrink_to_fit();
    }

    in += n_els * sizeof(saved_type);
}